

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpbyepacket.h
# Opt level: O0

uint8_t * __thiscall jrtplib::RTCPBYEPacket::GetReasonData(RTCPBYEPacket *this)

{
  uint8_t *reasonlen;
  RTCPBYEPacket *this_local;
  
  if (((this->super_RTCPPacket).knownformat & 1U) == 0) {
    this_local = (RTCPBYEPacket *)0x0;
  }
  else if (this->reasonoffset == 0) {
    this_local = (RTCPBYEPacket *)0x0;
  }
  else if ((this->super_RTCPPacket).data[this->reasonoffset] == '\0') {
    this_local = (RTCPBYEPacket *)0x0;
  }
  else {
    this_local = (RTCPBYEPacket *)((this->super_RTCPPacket).data + this->reasonoffset + 1);
  }
  return (uint8_t *)this_local;
}

Assistant:

inline uint8_t *RTCPBYEPacket::GetReasonData()
{
	if (!knownformat)
		return 0;
	if (reasonoffset == 0)
		return 0;
	uint8_t *reasonlen = (data+reasonoffset);
	if ((*reasonlen) == 0)
		return 0;
	return (data+reasonoffset+1);	
}